

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flattexture.cpp
# Opt level: O3

BYTE * __thiscall FFlatTexture::GetColumn(FFlatTexture *this,uint column,Span **spans_out)

{
  ushort uVar1;
  ushort uVar2;
  
  if (this->Pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  uVar1 = (this->super_FTexture).Width;
  if (uVar1 <= column) {
    uVar2 = (this->super_FTexture).WidthMask;
    if (uVar2 + 1 == (uint)uVar1) {
      column = uVar2 & column;
    }
    else {
      column = column % (uint)uVar1;
    }
  }
  if (spans_out != (Span **)0x0) {
    *spans_out = this->DummySpans;
  }
  return this->Pixels + column * (this->super_FTexture).Height;
}

Assistant:

const BYTE *FFlatTexture::GetColumn (unsigned int column, const Span **spans_out)
{
	if (Pixels == NULL)
	{
		MakeTexture ();
	}
	if ((unsigned)column >= (unsigned)Width)
	{
		if (WidthMask + 1 == Width)
		{
			column &= WidthMask;
		}
		else
		{
			column %= Width;
		}
	}
	if (spans_out != NULL)
	{
		*spans_out = DummySpans;
	}
	return Pixels + column*Height;
}